

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

int get_status(igsc_device_handle *handle)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint8_t result;
  uint8_t tiles_num;
  uint32_t ifr_applied;
  uint32_t supported_tests;
  char local_46;
  byte local_45;
  uint local_44;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  local_44 = 0;
  local_45 = 0;
  local_46 = '\0';
  iVar2 = 3;
  do {
    iVar1 = igsc_ifr_get_status(handle,&local_46,&local_40,&local_44,&local_45);
    if (iVar1 != 0xd) {
      if (local_46 == '\0' && iVar1 == 0) {
        iVar2 = 0;
        printf("Number of tiles: %u\n",(ulong)local_45);
        printf("Supported tests: scan_test: %u, array test: %u\n",(ulong)(local_40 & 1),
               (ulong)(local_40 >> 1 & 1));
        printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",(ulong)(local_44 & 1),
               (ulong)(local_44 >> 1 & 1));
        goto LAB_0010b756;
      }
      break;
    }
    usleep(2000000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 1;
  if (quiet == '\0') {
    get_status_cold_1();
    iVar2 = local_3c;
  }
LAB_0010b756:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

mockable_static
int get_status(struct igsc_device_handle *handle)
{
    int      ret;
    uint32_t supported_tests = 0;
    uint32_t ifr_applied = 0;
    uint8_t  tiles_num = 0;
    uint8_t  result = 0;
    unsigned int retries = 0;

    /* call the igsc library routine to get the ifr status */
    while ((ret = igsc_ifr_get_status(handle, &result, &supported_tests, &ifr_applied, &tiles_num)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret || result)
    {
        fwupd_error("Failed to get ifr status, library return code %d, command result %u\n",
                    ret, result);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    printf("Number of tiles: %u\n", tiles_num);
    printf("Supported tests: scan_test: %u, array test: %u\n",
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_SCAN),
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_ARRAY));
    printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",
           !!(ifr_applied & IGSC_IFR_REPAIR_DSS_EN),
           !!(ifr_applied &IGSC_IFR_REPAIR_ARRAY));

    return ret;
}